

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_process.cc
# Opt level: O0

int flyd::flyd_daemon(void)

{
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  LogLevel LVar1;
  __pid_t _Var2;
  int iVar3;
  LogStream *this;
  int fd;
  int i;
  int flag;
  undefined8 in_stack_ffffffffffff9008;
  Logger *pLVar4;
  Logger *in_stack_ffffffffffff9010;
  char (*in_stack_ffffffffffff9018) [102];
  SourceFile *in_stack_ffffffffffff9020;
  Logger *in_stack_ffffffffffff9040;
  Logger local_6f70;
  Logger local_5f88;
  Logger local_4fa0;
  int local_3fc4;
  undefined4 local_2fd4;
  Logger local_2fc0;
  Logger local_1fd8;
  Logger local_fe0;
  __pid_t local_8;
  int local_4;
  
  umask(0);
  local_8 = fork();
  if (local_8 == -1) {
    muduo::Logger::SourceFile::SourceFile<102>(in_stack_ffffffffffff9020,in_stack_ffffffffffff9018);
    file._8_8_ = in_stack_ffffffffffff9020;
    file.data_ = *in_stack_ffffffffffff9018;
    muduo::Logger::Logger
              (in_stack_ffffffffffff9010,file,(int)((ulong)in_stack_ffffffffffff9008 >> 0x20),
               (LogLevel)in_stack_ffffffffffff9008);
    muduo::Logger::stream(&local_fe0);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffff9020,*in_stack_ffffffffffff9018);
    muduo::Logger::~Logger(in_stack_ffffffffffff9040);
    local_4 = -1;
  }
  else if (local_8 == 0) {
    LVar1 = muduo::Logger::logLevel();
    if ((int)LVar1 < 3) {
      muduo::Logger::SourceFile::SourceFile<102>
                (in_stack_ffffffffffff9020,in_stack_ffffffffffff9018);
      file_00._8_8_ = in_stack_ffffffffffff9020;
      file_00.data_ = *in_stack_ffffffffffff9018;
      muduo::Logger::Logger
                (in_stack_ffffffffffff9010,file_00,(int)((ulong)in_stack_ffffffffffff9008 >> 0x20));
      muduo::Logger::stream(&local_1fd8);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff9020,*in_stack_ffffffffffff9018);
      muduo::Logger::~Logger(in_stack_ffffffffffff9040);
    }
    prctl(0xf,mater_name);
    flyd_process = FLYD_MASTER_PROCESS;
    _Var2 = setsid();
    if (_Var2 == -1) {
      muduo::Logger::SourceFile::SourceFile<102>
                (in_stack_ffffffffffff9020,in_stack_ffffffffffff9018);
      file_01._8_8_ = in_stack_ffffffffffff9020;
      file_01.data_ = *in_stack_ffffffffffff9018;
      muduo::Logger::Logger
                (in_stack_ffffffffffff9010,file_01,(int)((ulong)in_stack_ffffffffffff9008 >> 0x20),
                 (LogLevel)in_stack_ffffffffffff9008);
      muduo::Logger::stream(&local_2fc0);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffff9020,*in_stack_ffffffffffff9018);
      muduo::Logger::~Logger(in_stack_ffffffffffff9040);
      local_4 = -1;
    }
    else {
      local_2fd4 = 0;
      local_3fc4 = open("/dev/null",2);
      if (local_3fc4 == -1) {
        muduo::Logger::SourceFile::SourceFile<102>
                  (in_stack_ffffffffffff9020,in_stack_ffffffffffff9018);
        file_02._8_8_ = in_stack_ffffffffffff9020;
        file_02.data_ = *in_stack_ffffffffffff9018;
        muduo::Logger::Logger
                  (in_stack_ffffffffffff9010,file_02,(int)((ulong)in_stack_ffffffffffff9008 >> 0x20)
                   ,(LogLevel)in_stack_ffffffffffff9008);
        muduo::Logger::stream(&local_4fa0);
        muduo::LogStream::operator<<
                  ((LogStream *)in_stack_ffffffffffff9020,*in_stack_ffffffffffff9018);
        muduo::Logger::~Logger(in_stack_ffffffffffff9040);
        local_4 = -1;
      }
      else {
        iVar3 = dup2(local_3fc4,0);
        if (iVar3 == -1) {
          muduo::Logger::SourceFile::SourceFile<102>
                    (in_stack_ffffffffffff9020,in_stack_ffffffffffff9018);
          pLVar4 = &local_5f88;
          file_03._8_8_ = in_stack_ffffffffffff9020;
          file_03.data_ = (char *)pLVar4;
          muduo::Logger::Logger
                    (in_stack_ffffffffffff9010,file_03,
                     (int)((ulong)in_stack_ffffffffffff9008 >> 0x20),
                     (LogLevel)in_stack_ffffffffffff9008);
          this = muduo::Logger::stream(pLVar4);
          muduo::LogStream::operator<<(this,(char *)pLVar4);
          muduo::Logger::~Logger(in_stack_ffffffffffff9040);
          local_4 = -1;
        }
        else {
          iVar3 = dup2(local_3fc4,1);
          if (iVar3 == -1) {
            muduo::Logger::SourceFile::SourceFile<102>
                      (in_stack_ffffffffffff9020,in_stack_ffffffffffff9018);
            pLVar4 = &local_6f70;
            file_04._8_8_ = in_stack_ffffffffffff9020;
            file_04.data_ = *in_stack_ffffffffffff9018;
            muduo::Logger::Logger
                      (in_stack_ffffffffffff9010,file_04,(int)((ulong)pLVar4 >> 0x20),
                       (LogLevel)pLVar4);
            muduo::Logger::stream(pLVar4);
            muduo::LogStream::operator<<
                      ((LogStream *)in_stack_ffffffffffff9020,*in_stack_ffffffffffff9018);
            muduo::Logger::~Logger(in_stack_ffffffffffff9040);
            local_4 = -1;
          }
          else {
            local_4 = 0;
          }
        }
      }
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int flyd_daemon() {

        //1.给予守护进程最高文件权限
        umask(0);

        //2.fork子进程作为守护进程
        int flag;
        flag = fork();
        switch (flag)  //fork()出来这个子进程才会成为咱们这里讲解的master进程；
        {
            case -1:
                //创建子进程失败
                LOG_FATAL << "创建master子进程失败,退出\n";
                return -1;
            case 0:
                //master子进程，走到这里直接break;
                LOG_INFO << "THIS IS MASTER PROCESS\n ";
                prctl(PR_SET_NAME, mater_name);
                flyd_process = FLYD_MASTER_PROCESS;
                break;
            default:
                //父进程以往 直接退出exit(0);现在希望回到主流程去释放一些资源
                return 1;  //父进程直接返回1；
                // exit(0);
        } //end switch


        //以下都是master子进程的程序空间了
        //3.调用setsid设置新的会话
        if (setsid() == -1) {
            LOG_ERROR<<"flyd_daemon()中setsid()失败!\n";
            return -1;
        }

        //4.更改文件目录为根文件目录
        //5.关闭用不到的文件描述符
        int i = 0;
        if (i > STDERR_FILENO)  //fd应该是3，这个应该成立
        {
            if (close(i) == -1)  //释放资源这样这个文件描述符就可以被复用；不然这个数字【文件描述符】会被一直占着；
            {
                LOG_ERROR << "ngx_daemon()中close(fd)失败!\n";
                return -1;
            }
        }

        //6.重定向标准输入输出
        int fd = open("/dev/null", O_RDWR);
        if (fd == -1) {
            LOG_ERROR << "ngx_daemon()中open(\"/dev/null\")失败!\n";
            return -1;
        }
        if (dup2(fd, STDIN_FILENO) == -1) //先关闭STDIN_FILENO[这是规矩，已经打开的描述符，动他之前，先close]，类似于指针指向null，让/dev/null成为标准输入；
        {
            LOG_ERROR << "ngx_daemon()中dup2(STDIN)失败!\n";
            return -1;
        }
        if (dup2(fd, STDOUT_FILENO) == -1) //再关闭STDIN_FILENO，类似于指针指向null，让/dev/null成为标准输出；
        {
            LOG_ERROR << "ngx_daemon()中dup2(STDOUT)失败!\n";
            return -1;
        }

        return 0;  //子进程返回
    }